

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

WebPMuxError MuxValidate(WebPMux *mux)

{
  uint uVar1;
  uint uVar2;
  WebPMuxError WVar3;
  WebPMuxError WVar4;
  WebPMuxImage *pWVar5;
  uint32_t flags;
  int num_alpha;
  int num_images;
  int num_vp8x;
  int num_frames;
  int num_anim;
  int num_xmp;
  int num_exif;
  int num_iccp;
  uint local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  if (mux == (WebPMux *)0x0) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  if (mux->images_ != (WebPMuxImage *)0x0) {
    WVar3 = WebPMuxGetFeatures(mux,&local_3c);
    uVar1 = local_3c;
    if (WVar3 != WEBP_MUX_OK) {
      return WVar3;
    }
    WVar3 = WebPMuxNumChunks(mux,WEBP_CHUNK_ICCP,&local_1c);
    uVar2 = local_3c;
    if ((WVar3 == WEBP_MUX_OK) && (WVar3 = WEBP_MUX_INVALID_ARGUMENT, local_1c < 2)) {
      WVar3 = (uint)(byte)(local_1c != 1 ^ (byte)((uVar1 & 0x20) >> 5)) + WEBP_MUX_INVALID_ARGUMENT
              | WEBP_MUX_OK;
    }
    if (WVar3 != WEBP_MUX_OK) {
      return WVar3;
    }
    WVar3 = WebPMuxNumChunks(mux,WEBP_CHUNK_EXIF,&local_20);
    uVar1 = local_3c;
    if ((WVar3 == WEBP_MUX_OK) && (WVar3 = WEBP_MUX_INVALID_ARGUMENT, local_20 < 2)) {
      WVar3 = (uint)(byte)(local_20 != 1 ^ (byte)((uVar2 & 8) >> 3)) + WEBP_MUX_INVALID_ARGUMENT |
              WEBP_MUX_OK;
    }
    if (WVar3 != WEBP_MUX_OK) {
      return WVar3;
    }
    WVar3 = WebPMuxNumChunks(mux,WEBP_CHUNK_XMP,&local_24);
    if ((WVar3 == WEBP_MUX_OK) && (WVar3 = WEBP_MUX_INVALID_ARGUMENT, local_24 < 2)) {
      WVar3 = (uint)(byte)(local_24 != 1 ^ (byte)((uVar1 & 4) >> 2)) + WEBP_MUX_INVALID_ARGUMENT |
              WEBP_MUX_OK;
    }
    if (WVar3 != WEBP_MUX_OK) {
      return WVar3;
    }
    WVar4 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANIM,&local_28);
    WVar3 = (uint)(local_28 < 2) * 2 + WEBP_MUX_INVALID_ARGUMENT;
    if (WVar4 != WEBP_MUX_OK) {
      WVar3 = WVar4;
    }
    if (WVar3 != WEBP_MUX_OK) {
      return WVar3;
    }
    WVar3 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANMF,&local_2c);
    if (WVar3 != WEBP_MUX_OK) {
      return WVar3;
    }
    if ((local_3c & 2) == 0) {
      if (0 < local_2c || local_28 == 1) {
        return WEBP_MUX_INVALID_ARGUMENT;
      }
      if ((local_3c & 2) == 0) {
        pWVar5 = mux->images_;
        if (pWVar5 == (WebPMuxImage *)0x0) {
          return WEBP_MUX_INVALID_ARGUMENT;
        }
        if (pWVar5->next_ != (WebPMuxImage *)0x0) {
          return WEBP_MUX_INVALID_ARGUMENT;
        }
        if (0 < mux->canvas_width_) {
          if (pWVar5->width_ != mux->canvas_width_) {
            return WEBP_MUX_INVALID_ARGUMENT;
          }
          if (pWVar5->height_ != mux->canvas_height_) {
            return WEBP_MUX_INVALID_ARGUMENT;
          }
        }
      }
    }
    else if (local_2c == 0 || local_28 == 0) {
      return WEBP_MUX_INVALID_ARGUMENT;
    }
    WVar4 = WebPMuxNumChunks(mux,WEBP_CHUNK_VP8X,&local_30);
    WVar3 = (uint)(local_30 < 2) * 2 + WEBP_MUX_INVALID_ARGUMENT;
    if (WVar4 != WEBP_MUX_OK) {
      WVar3 = WVar4;
    }
    if (WVar3 != WEBP_MUX_OK) {
      return WVar3;
    }
    WVar3 = WebPMuxNumChunks(mux,WEBP_CHUNK_IMAGE,&local_34);
    if (WVar3 != WEBP_MUX_OK) {
      return WVar3;
    }
    if ((local_30 != 0) || (local_34 == 1)) {
      pWVar5 = mux->images_;
      while( true ) {
        if (pWVar5 == (WebPMuxImage *)0x0) {
          return WEBP_MUX_OK;
        }
        if (pWVar5->has_alpha_ != 0) break;
        pWVar5 = pWVar5->next_;
      }
      if (0 < local_30) {
        if ((local_3c & 0x10) != 0) {
          return WEBP_MUX_OK;
        }
        return WEBP_MUX_INVALID_ARGUMENT;
      }
      WVar3 = WebPMuxNumChunks(mux,WEBP_CHUNK_ALPHA,&local_38);
      if (WVar3 != WEBP_MUX_OK) {
        return WVar3;
      }
      if (local_38 < 1) {
        return WEBP_MUX_OK;
      }
      return WEBP_MUX_INVALID_ARGUMENT;
    }
  }
  return WEBP_MUX_INVALID_ARGUMENT;
}

Assistant:

WebPMuxError MuxValidate(const WebPMux* const mux) {
  int num_iccp;
  int num_exif;
  int num_xmp;
  int num_anim;
  int num_frames;
  int num_vp8x;
  int num_images;
  int num_alpha;
  uint32_t flags;
  WebPMuxError err;

  // Verify mux is not NULL.
  if (mux == NULL) return WEBP_MUX_INVALID_ARGUMENT;

  // Verify mux has at least one image.
  if (mux->images_ == NULL) return WEBP_MUX_INVALID_ARGUMENT;

  err = WebPMuxGetFeatures(mux, &flags);
  if (err != WEBP_MUX_OK) return err;

  // At most one color profile chunk.
  err = ValidateChunk(mux, IDX_ICCP, ICCP_FLAG, flags, 1, &num_iccp);
  if (err != WEBP_MUX_OK) return err;

  // At most one EXIF metadata.
  err = ValidateChunk(mux, IDX_EXIF, EXIF_FLAG, flags, 1, &num_exif);
  if (err != WEBP_MUX_OK) return err;

  // At most one XMP metadata.
  err = ValidateChunk(mux, IDX_XMP, XMP_FLAG, flags, 1, &num_xmp);
  if (err != WEBP_MUX_OK) return err;

  // Animation: ANIMATION_FLAG, ANIM chunk and ANMF chunk(s) are consistent.
  // At most one ANIM chunk.
  err = ValidateChunk(mux, IDX_ANIM, NO_FLAG, flags, 1, &num_anim);
  if (err != WEBP_MUX_OK) return err;
  err = ValidateChunk(mux, IDX_ANMF, NO_FLAG, flags, -1, &num_frames);
  if (err != WEBP_MUX_OK) return err;

  {
    const int has_animation = !!(flags & ANIMATION_FLAG);
    if (has_animation && (num_anim == 0 || num_frames == 0)) {
      return WEBP_MUX_INVALID_ARGUMENT;
    }
    if (!has_animation && (num_anim == 1 || num_frames > 0)) {
      return WEBP_MUX_INVALID_ARGUMENT;
    }
    if (!has_animation) {
      const WebPMuxImage* images = mux->images_;
      // There can be only one image.
      if (images == NULL || images->next_ != NULL) {
        return WEBP_MUX_INVALID_ARGUMENT;
      }
      // Size must match.
      if (mux->canvas_width_ > 0) {
        if (images->width_ != mux->canvas_width_ ||
            images->height_ != mux->canvas_height_) {
          return WEBP_MUX_INVALID_ARGUMENT;
        }
      }
    }
  }

  // Verify either VP8X chunk is present OR there is only one elem in
  // mux->images_.
  err = ValidateChunk(mux, IDX_VP8X, NO_FLAG, flags, 1, &num_vp8x);
  if (err != WEBP_MUX_OK) return err;
  err = ValidateChunk(mux, IDX_VP8, NO_FLAG, flags, -1, &num_images);
  if (err != WEBP_MUX_OK) return err;
  if (num_vp8x == 0 && num_images != 1) return WEBP_MUX_INVALID_ARGUMENT;

  // ALPHA_FLAG & alpha chunk(s) are consistent.
  // Note: ALPHA_FLAG can be set when there is actually no Alpha data present.
  if (MuxHasAlpha(mux->images_)) {
    if (num_vp8x > 0) {
      // VP8X chunk is present, so it should contain ALPHA_FLAG.
      if (!(flags & ALPHA_FLAG)) return WEBP_MUX_INVALID_ARGUMENT;
    } else {
      // VP8X chunk is not present, so ALPH chunks should NOT be present either.
      err = WebPMuxNumChunks(mux, WEBP_CHUNK_ALPHA, &num_alpha);
      if (err != WEBP_MUX_OK) return err;
      if (num_alpha > 0) return WEBP_MUX_INVALID_ARGUMENT;
    }
  }

  return WEBP_MUX_OK;
}